

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall
Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int,_int> *map,Var *max)

{
  byte bVar1;
  Clause CVar2;
  bool bVar3;
  anon_struct_4_5_613047fb_for_header aVar4;
  Var VVar5;
  char *pcVar6;
  int x;
  ulong uVar7;
  
  bVar3 = satisfied(this,c);
  if (bVar3) {
    return;
  }
  aVar4 = c->header;
  if (0x1f < (uint)aVar4) {
    uVar7 = 0;
    do {
      CVar2.header = c[uVar7 + 1].header;
      x = (int)CVar2.header >> 1;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          x) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[x].value;
      if (((CVar2.header._0_1_ & 1 ^ bVar1) != l_False || (l_False & 2) != 0) &&
          (bVar1 & l_False & 2) == 0) {
        pcVar6 = "-";
        if (((uint)CVar2.header & 1) == 0) {
          pcVar6 = "";
        }
        VVar5 = mapVar(x,map,max);
        fprintf((FILE *)f,"%s%d ",pcVar6,(ulong)(VVar5 + 1));
        aVar4 = c->header;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (uint)aVar4 >> 5);
  }
  fwrite("0\n",2,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, Clause& c, vec<Var>& map, Var& max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max)+1);
    fprintf(f, "0\n");
}